

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3lamb_io.c
# Opt level: O2

int s3lamb_write(char *fn,float32 *lambda,uint32 n_lambda)

{
  int iVar1;
  int32 iVar2;
  FILE *fp;
  int iVar3;
  uint32 chksum;
  uint32 ignore;
  
  chksum = 0;
  ignore = 0;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  fp = s3open(fn,"wb",(uint32 *)0x0);
  iVar3 = -1;
  if (fp != (FILE *)0x0) {
    iVar1 = bio_fwrite_1d(lambda,4,n_lambda,fp,&chksum);
    if (iVar1 == 0) {
      iVar2 = bio_fwrite(&chksum,4,1,fp,0,&ignore);
      s3close(fp);
      if (iVar2 == 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3lamb_io.c"
                ,0x95,"Wrote %s [%u array]\n",fn,(ulong)n_lambda);
        iVar3 = 0;
      }
    }
    else {
      s3close(fp);
    }
  }
  return iVar3;
}

Assistant:

int
s3lamb_write(const char *fn,
	     const float32 *lambda,
	     uint32 n_lambda)
{
    FILE *fp;
    uint32 chksum = 0;
    uint32 ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", LAMBDA_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);


    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite_1d((void *)lambda, sizeof(float32), n_lambda, fp, &chksum) != S3_SUCCESS) {
	s3close(fp);
	return S3_ERROR;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	s3close(fp);

	return S3_ERROR;
    }

    s3close(fp);

    E_INFO("Wrote %s [%u array]\n", fn, n_lambda);

    return S3_SUCCESS;
}